

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::anon_unknown_7::load_mvei_headers_intern(istream *in,ImageHeaders *headers)

{
  bool bVar1;
  Exception *pEVar2;
  char local_63 [8];
  char signature [11];
  int local_34;
  int local_30;
  int32_t height;
  int32_t channels;
  int32_t raw_type;
  int32_t width;
  
  std::istream::read((char *)in,(long)local_63);
  bVar1 = std::__equal<true>::equal<char>(local_63,signature + 3,anon_var_dwarf_5e215);
  if (!bVar1) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)(signature + 3),"Invalid file signature",(allocator *)&channels);
    util::Exception::Exception(pEVar2,(string *)(signature + 3));
    __cxa_throw(pEVar2,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  std::istream::read((char *)in,(long)&channels);
  std::istream::read((char *)in,(long)&local_34);
  std::istream::read((char *)in,(long)&local_30);
  std::istream::read((char *)in,(long)&height);
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    headers->width = channels;
    headers->height = local_34;
    headers->channels = local_30;
    headers->type = height;
    return;
  }
  pEVar2 = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)(signature + 3),"Error reading headers",(allocator *)((long)&raw_type + 3));
  util::Exception::Exception(pEVar2,(string *)(signature + 3));
  __cxa_throw(pEVar2,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
    load_mvei_headers_intern (std::istream& in, ImageHeaders* headers)
    {
        char signature[MVEI_FILE_SIGNATURE_LEN];
        in.read(signature, MVEI_FILE_SIGNATURE_LEN);
        if (!std::equal(signature, signature + MVEI_FILE_SIGNATURE_LEN,
            MVEI_FILE_SIGNATURE))
            throw util::Exception("Invalid file signature");

        /* Read image headers data, */
        int32_t width, height, channels, raw_type;
        in.read(reinterpret_cast<char*>(&width), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&height), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&channels), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&raw_type), sizeof(int32_t));

        if (!in.good())
            throw util::Exception("Error reading headers");

        headers->width = width;
        headers->height = height;
        headers->channels = channels;
        headers->type = static_cast<ImageType>(raw_type);
    }